

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

_Bool suffix(char *s,char *t)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  _Bool _Var4;
  
  sVar2 = strlen(t);
  sVar3 = strlen(s);
  if (sVar3 < sVar2) {
    _Var4 = false;
  }
  else {
    iVar1 = strcmp(s + (sVar3 - sVar2),t);
    _Var4 = iVar1 == 0;
  }
  return _Var4;
}

Assistant:

bool suffix(const char *s, const char *t)
{
	size_t tlen = strlen(t);
	size_t slen = strlen(s);

	/* Check for incompatible lengths */
	if (tlen > slen) return (false);

	/* Compare "t" to the end of "s" */
	return (!strcmp(s + slen - tlen, t));
}